

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMPrint.cpp
# Opt level: O0

void usage(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cout,
                         "\nUsage:\n    DOMPrint [options] <XML file>\n\nThis program invokes the DOM parser, and builds the DOM tree.\nIt then asks the DOMLSSerializer to serialize the DOM tree.\nOptions:\n    -e          create entity reference nodes. Default is no expansion.\n    -v=xxx      Validation scheme [always | never | auto*].\n    -n          Enable namespace processing. Default is off.\n    -s          Enable schema processing. Default is off.\n    -f          Enable full schema constraint checking. Defaults is off.\n    -wenc=XXX   Use a particular encoding for output. Default is\n                the same encoding as the input XML file. UTF-8 if\n                input XML file has not XML declaration.\n    -wfile=xxx  Write to a file instead of stdout.\n    -wscs=xxx   Enable/Disable split-cdata-sections.      Default on\n    -wddc=xxx   Enable/Disable discard-default-content.   Default on\n    -wflt=xxx   Enable/Disable filtering.                 Default off\n    -wfpp=xxx   Enable/Disable format-pretty-print.       Default off\n    -wfdecl=xxx Enable/Disable xml-declaration.           Default on\n    -wbom=xxx   Enable/Disable write Byte-Order-Mark      Default off\n    -xpath=xxx  Prints only the nodes matching the given XPath.\n    -?          Show this help.\n\n  * = Default if not provided explicitly.\n\nThe parser has intrinsic support for the following encodings:\n    UTF-8, US-ASCII, ISO8859-1, UTF-16[BL]E, UCS-4[BL]E,\n    WINDOWS-1252, IBM1140, IBM037, IBM1047.\n"
                        );
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void usage()
{
    std::cout << "\nUsage:\n"
            "    DOMPrint [options] <XML file>\n\n"
            "This program invokes the DOM parser, and builds the DOM tree.\n"
            "It then asks the DOMLSSerializer to serialize the DOM tree.\n"
            "Options:\n"
            "    -e          create entity reference nodes. Default is no expansion.\n"
            "    -v=xxx      Validation scheme [always | never | auto*].\n"
            "    -n          Enable namespace processing. Default is off.\n"
            "    -s          Enable schema processing. Default is off.\n"
            "    -f          Enable full schema constraint checking. Defaults is off.\n"
            "    -wenc=XXX   Use a particular encoding for output. Default is\n"
            "                the same encoding as the input XML file. UTF-8 if\n"
            "                input XML file has not XML declaration.\n"
            "    -wfile=xxx  Write to a file instead of stdout.\n"
            "    -wscs=xxx   Enable/Disable split-cdata-sections.      Default on\n"
            "    -wddc=xxx   Enable/Disable discard-default-content.   Default on\n"
            "    -wflt=xxx   Enable/Disable filtering.                 Default off\n"
            "    -wfpp=xxx   Enable/Disable format-pretty-print.       Default off\n"
            "    -wfdecl=xxx Enable/Disable xml-declaration.           Default on\n"
            "    -wbom=xxx   Enable/Disable write Byte-Order-Mark      Default off\n"
            "    -xpath=xxx  Prints only the nodes matching the given XPath.\n"
            "    -?          Show this help.\n\n"
            "  * = Default if not provided explicitly.\n\n"
            "The parser has intrinsic support for the following encodings:\n"
            "    UTF-8, US-ASCII, ISO8859-1, UTF-16[BL]E, UCS-4[BL]E,\n"
            "    WINDOWS-1252, IBM1140, IBM037, IBM1047.\n"
          <<  std::endl;
}